

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

ssize_t sftp_read(LIBSSH2_SFTP_HANDLE *handle,char *buffer,size_t buffer_size)

{
  libssh2_nonblocking_states lVar1;
  sftp_pipeline_chunk *psVar2;
  int iVar3;
  uint32_t uVar4;
  sftp_pipeline_chunk *psVar5;
  sftp_pipeline_chunk *local_d8;
  size_t local_d0;
  uint local_c4;
  size_t sStack_c0;
  uint32_t rc32;
  size_t data_len;
  uchar *data;
  uint32_t local_a8;
  uint32_t size;
  uint32_t request_id;
  uint32_t packet_len;
  uchar *s;
  unsigned_long recv_window;
  size_t max_read_ahead;
  size_t already;
  size_t copy;
  char *sliding_bufferp;
  size_t bytes_in_buffer;
  _libssh2_sftp_handle_file_data *filep;
  ssize_t rc;
  sftp_pipeline_chunk *next;
  sftp_pipeline_chunk *chunk;
  size_t count;
  LIBSSH2_SESSION *session;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SFTP *sftp;
  size_t buffer_size_local;
  char *buffer_local;
  LIBSSH2_SFTP_HANDLE *handle_local;
  
  channel = (LIBSSH2_CHANNEL *)handle->sftp;
  session = (LIBSSH2_SESSION *)(channel->node).next;
  count = (size_t)session->kex_prefs;
  chunk = (sftp_pipeline_chunk *)0x0;
  bytes_in_buffer = (size_t)&handle->u;
  sliding_bufferp = (char *)0x0;
  lVar1 = *(libssh2_nonblocking_states *)&channel->field_0xa4;
  copy = (size_t)buffer;
  sftp = (LIBSSH2_SFTP *)buffer_size;
  buffer_size_local = (size_t)buffer;
  buffer_local = (char *)handle;
  if (lVar1 == libssh2_NB_state_idle) {
    *(uint32_t *)&(channel->local).close = 0;
    if ((handle->u).file.data_left != 0) {
      local_d0 = buffer_size;
      if ((handle->u).file.data_left <= buffer_size) {
        local_d0 = (handle->u).file.data_left;
      }
      already = local_d0;
      memcpy(buffer,(handle->u).file.data + ((handle->u).file.data_len - (handle->u).file.data_left)
             ,local_d0);
      *(size_t *)(bytes_in_buffer + 0x28) = *(long *)(bytes_in_buffer + 0x28) - already;
      *(size_t *)bytes_in_buffer = already + *(long *)bytes_in_buffer;
      if (*(long *)(bytes_in_buffer + 0x28) == 0) {
        (**(code **)(count + 0x18))(*(undefined8 *)(bytes_in_buffer + 0x18),count);
        *(undefined8 *)(bytes_in_buffer + 0x18) = 0;
      }
      return already;
    }
    if ((handle->u).file.eof != '\0') {
      return 0;
    }
    max_read_ahead =
         (long)(handle->u).dir.names_packet -
         ((_libssh2_sftp_handle_file_data *)bytes_in_buffer)->offset;
    recv_window = buffer_size << 2;
    if (0x800000 < recv_window) {
      recv_window = 0x800000;
    }
    if (max_read_ahead < recv_window) {
      chunk = (sftp_pipeline_chunk *)(recv_window - max_read_ahead);
    }
    s = (uchar *)libssh2_channel_window_read_ex
                           ((LIBSSH2_CHANNEL *)(channel->node).next,(unsigned_long *)0x0,
                            (unsigned_long *)0x0);
    if (s < recv_window) {
      iVar3 = _libssh2_channel_receive_window_adjust
                        ((LIBSSH2_CHANNEL *)(channel->node).next,(uint32_t)(recv_window << 3),'\x01'
                         ,(uint *)0x0);
      filep = (_libssh2_sftp_handle_file_data *)(long)iVar3;
      if ((filep == (_libssh2_sftp_handle_file_data *)0xffffffffffffffdb) &&
         (*(long *)(bytes_in_buffer + 0x28) != 0)) {
        __assert_fail("rc != LIBSSH2_ERROR_EAGAIN || !filep->data_left",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/palmin[P]libssh2/src/sftp.c"
                      ,0x60a,"ssize_t sftp_read(LIBSSH2_SFTP_HANDLE *, char *, size_t)");
      }
      if ((filep == (_libssh2_sftp_handle_file_data *)0xffffffffffffffdb) &&
         (*(char *)(bytes_in_buffer + 0x30) != '\0')) {
        __assert_fail("rc != LIBSSH2_ERROR_EAGAIN || !filep->eof",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/palmin[P]libssh2/src/sftp.c"
                      ,0x60b,"ssize_t sftp_read(LIBSSH2_SFTP_HANDLE *, char *, size_t)");
      }
      if (filep != (_libssh2_sftp_handle_file_data *)0x0) {
        return (ssize_t)filep;
      }
      filep = (_libssh2_sftp_handle_file_data *)0x0;
    }
    for (; chunk != (sftp_pipeline_chunk *)0x0;
        chunk = (sftp_pipeline_chunk *)((long)chunk - (long)local_d8)) {
      size = (int)*(undefined8 *)(buffer_local + 0x120) + 0x19;
      data._4_4_ = (uint)chunk;
      if ((LIBSSH2_SFTP *)((ulong)chunk & 0xffffffff) < sftp) {
        data._4_4_ = (uint)sftp;
      }
      if (30000 < data._4_4_) {
        data._4_4_ = 30000;
      }
      next = (sftp_pipeline_chunk *)(**(code **)(count + 8))((ulong)size + 0x40,count);
      if (next == (sftp_pipeline_chunk *)0x0) {
        iVar3 = _libssh2_error((LIBSSH2_SESSION *)count,-6,"malloc fail for FXP_WRITE");
        return (long)iVar3;
      }
      next->offset = *(libssh2_uint64_t *)(bytes_in_buffer + 8);
      next->len = (ulong)data._4_4_;
      next->lefttosend = (ulong)size;
      next->sent = 0;
      _request_id = next->packet;
      _libssh2_store_u32((uchar **)&request_id,size - 4);
      *_request_id = '\x05';
      local_a8 = *(uint32_t *)&(channel->node).prev;
      *(uint32_t *)&(channel->node).prev = local_a8 + 1;
      next->request_id = local_a8;
      _request_id = _request_id + 1;
      _libssh2_store_u32((uchar **)&request_id,local_a8);
      _libssh2_store_str((uchar **)&request_id,buffer_local + 0x20,*(size_t *)(buffer_local + 0x120)
                        );
      _libssh2_store_u64((uchar **)&request_id,*(libssh2_uint64_t *)(bytes_in_buffer + 8));
      *(ulong *)(bytes_in_buffer + 8) = (ulong)data._4_4_ + *(long *)(bytes_in_buffer + 8);
      _libssh2_store_u32((uchar **)&request_id,data._4_4_);
      _libssh2_list_add((list_head *)(buffer_local + 0x178),&next->node);
      if ((sftp_pipeline_chunk *)(ulong)data._4_4_ < chunk) {
        local_d8 = (sftp_pipeline_chunk *)(ulong)data._4_4_;
      }
      else {
        local_d8 = chunk;
      }
    }
  }
  else if (lVar1 != libssh2_NB_state_sent) {
    if (lVar1 != libssh2_NB_state_sent2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/palmin[P]libssh2/src/sftp.c"
                    ,0x710,"ssize_t sftp_read(LIBSSH2_SFTP_HANDLE *, char *, size_t)");
    }
    goto LAB_00136cce;
  }
  *(undefined4 *)&channel->field_0xa4 = 0;
  next = (sftp_pipeline_chunk *)_libssh2_list_first((list_head *)(buffer_local + 0x178));
  do {
    while( true ) {
      if (next == (sftp_pipeline_chunk *)0x0) goto LAB_00136cce;
      if (next->lefttosend != 0) break;
LAB_00136cba:
      next = (sftp_pipeline_chunk *)_libssh2_list_next(&next->node);
    }
    filep = (_libssh2_sftp_handle_file_data *)
            _libssh2_channel_write
                      ((LIBSSH2_CHANNEL *)session,0,next->packet + next->sent,next->lefttosend);
    psVar2 = next;
    if ((long)filep < 0) {
      *(undefined4 *)&channel->field_0xa4 = 3;
      return (ssize_t)filep;
    }
    next->lefttosend = next->lefttosend - (long)filep;
    next->sent = (long)&filep->offset + next->sent;
    if (next->lefttosend == 0) goto LAB_00136cba;
    psVar5 = (sftp_pipeline_chunk *)_libssh2_list_first((list_head *)(buffer_local + 0x178));
  } while (psVar2 == psVar5);
LAB_00136cce:
  *(undefined4 *)&channel->field_0xa4 = 0;
  next = (sftp_pipeline_chunk *)_libssh2_list_first((list_head *)(buffer_local + 0x178));
  while( true ) {
    if (next == (sftp_pipeline_chunk *)0x0) {
      if (sliding_bufferp == (char *)0x0) {
        iVar3 = _libssh2_error((LIBSSH2_SESSION *)count,-0x1f,"sftp_read() internal error");
        handle_local = (LIBSSH2_SFTP_HANDLE *)(long)iVar3;
      }
      else {
        handle_local = (LIBSSH2_SFTP_HANDLE *)sliding_bufferp;
      }
      return (ssize_t)handle_local;
    }
    sStack_c0 = 0;
    if (next->lefttosend != 0) {
      if (sliding_bufferp != (char *)0x0) {
        return (ssize_t)sliding_bufferp;
      }
      iVar3 = _libssh2_error((LIBSSH2_SESSION *)count,-0x1f,"sftp_read() internal error");
      return (long)iVar3;
    }
    iVar3 = sftp_packet_requirev
                      ((LIBSSH2_SFTP *)channel,2,"ge",next->request_id,(uchar **)&data_len,
                       &stack0xffffffffffffff40,9);
    filep = (_libssh2_sftp_handle_file_data *)(long)iVar3;
    if ((filep == (_libssh2_sftp_handle_file_data *)0xffffffffffffffdb) &&
       (sliding_bufferp != (char *)0x0)) {
      return (ssize_t)sliding_bufferp;
    }
    if (filep == (_libssh2_sftp_handle_file_data *)0xffffffffffffffda) {
      if (sStack_c0 != 0) {
        (**(code **)(count + 0x18))(data_len,count);
      }
      iVar3 = _libssh2_error((LIBSSH2_SESSION *)count,-0x1f,"Response too small");
      return (long)iVar3;
    }
    if ((long)filep < 0) {
      *(undefined4 *)&channel->field_0xa4 = 5;
      return (ssize_t)filep;
    }
    if (*(char *)data_len == 'e') {
      _libssh2_list_remove(&next->node);
      (**(code **)(count + 0x18))(next,count);
      sftp_packetlist_flush((LIBSSH2_SFTP_HANDLE *)buffer_local);
      uVar4 = _libssh2_ntohu32((uchar *)(data_len + 5));
      (**(code **)(count + 0x18))(data_len,count);
      if (uVar4 == 1) {
        *(undefined1 *)(bytes_in_buffer + 0x30) = 1;
        return (ssize_t)sliding_bufferp;
      }
      (channel->local).close = (char)uVar4;
      (channel->local).eof = (char)(uVar4 >> 8);
      (channel->local).extended_data_ignore_mode = (char)(uVar4 >> 0x10);
      (channel->local).field_0x13 = (char)(uVar4 >> 0x18);
      iVar3 = _libssh2_error((LIBSSH2_SESSION *)count,-0x1f,"SFTP READ error");
      return (long)iVar3;
    }
    if (*(char *)data_len != 'g') {
      iVar3 = _libssh2_error((LIBSSH2_SESSION *)count,-0x1f,
                             "SFTP Protocol badness: unrecognised read request response");
      return (long)iVar3;
    }
    if (next->offset != *(libssh2_uint64_t *)bytes_in_buffer) {
      iVar3 = _libssh2_error((LIBSSH2_SESSION *)count,-0x1f,"Read Packet At Unexpected Offset");
      return (long)iVar3;
    }
    local_c4 = _libssh2_ntohu32((uchar *)(data_len + 5));
    if (sStack_c0 - 9 < (ulong)local_c4) break;
    if (next->len < (ulong)local_c4) {
      iVar3 = _libssh2_error((LIBSSH2_SESSION *)count,-0x1f,"FXP_READ response too big");
      return (long)iVar3;
    }
    if ((ulong)local_c4 != next->len) {
      *(size_t *)(bytes_in_buffer + 8) =
           *(long *)(bytes_in_buffer + 8) - (next->len - (ulong)local_c4);
    }
    if (sftp < (LIBSSH2_SFTP *)(sliding_bufferp + local_c4)) {
      *(char **)(bytes_in_buffer + 0x28) = sliding_bufferp + ((ulong)local_c4 - (long)sftp);
      local_c4 = (int)sftp - (int)sliding_bufferp;
      *(size_t *)(bytes_in_buffer + 0x18) = data_len;
      *(size_t *)(bytes_in_buffer + 0x20) = sStack_c0;
    }
    else {
      *(undefined8 *)(bytes_in_buffer + 0x20) = 0;
    }
    memcpy((void *)copy,(void *)(data_len + 9),(ulong)local_c4);
    *(ulong *)bytes_in_buffer = (ulong)local_c4 + *(long *)bytes_in_buffer;
    sliding_bufferp = sliding_bufferp + local_c4;
    copy = copy + local_c4;
    if (*(long *)(bytes_in_buffer + 0x20) == 0) {
      (**(code **)(count + 0x18))(data_len,count);
    }
    rc = (ssize_t)_libssh2_list_next(&next->node);
    _libssh2_list_remove(&next->node);
    (**(code **)(count + 0x18))(next,count);
    if (sliding_bufferp < sftp) {
      next = (sftp_pipeline_chunk *)rc;
    }
    else {
      next = (sftp_pipeline_chunk *)0x0;
    }
  }
  iVar3 = _libssh2_error((LIBSSH2_SESSION *)count,-0x1f,"SFTP Protocol badness");
  return (long)iVar3;
}

Assistant:

static ssize_t sftp_read(LIBSSH2_SFTP_HANDLE * handle, char *buffer,
                         size_t buffer_size)
{
    LIBSSH2_SFTP *sftp = handle->sftp;
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    size_t count = 0;
    struct sftp_pipeline_chunk *chunk;
    struct sftp_pipeline_chunk *next;
    ssize_t rc;
    struct _libssh2_sftp_handle_file_data *filep =
        &handle->u.file;
    size_t bytes_in_buffer = 0;
    char *sliding_bufferp = buffer;

    /* This function can be interrupted in three different places where it
       might need to wait for data from the network.  It returns EAGAIN to
       allow non-blocking clients to do other work but these client are
       expected to call this function again (possibly many times) to finish
       the operation.

       The tricky part is that if we previously aborted a sftp_read due to
       EAGAIN, we must continue at the same spot to continue the previously
       interrupted operation.  This is done using a state machine to record
       what phase of execution we were at.  The state is stored in
       sftp->read_state.

       libssh2_NB_state_idle: The first phase is where we prepare multiple
       FXP_READ packets to do optimistic read-ahead.  We send off as many as
       possible in the second phase without waiting for a response to each
       one; this is the key to fast reads. But we may have to adjust the
       channel window size to do this which may interrupt this function while
       waiting.  The state machine saves the phase as libssh2_NB_state_idle so
       it returns here on the next call.

       libssh2_NB_state_sent: The second phase is where we send the FXP_READ
       packets.  Writing them to the channel can be interrupted with EAGAIN
       but the state machine ensures we skip the first phase on the next call
       and resume sending.

       libssh2_NB_state_sent2: In the third phase (indicated by ) we read the
       data from the responses that have arrived so far.  Reading can be
       interrupted with EAGAIN but the state machine ensures we skip the first
       and second phases on the next call and resume sending.
    */

    switch(sftp->read_state) {
    case libssh2_NB_state_idle:
        sftp->last_errno = LIBSSH2_FX_OK;

        /* Some data may already have been read from the server in the
           previous call but didn't fit in the buffer at the time.  If so, we
           return that now as we can't risk being interrupted later with data
           partially written to the buffer. */
        if(filep->data_left) {
            size_t copy = LIBSSH2_MIN(buffer_size, filep->data_left);

            memcpy(buffer, &filep->data[ filep->data_len - filep->data_left],
                   copy);

            filep->data_left -= copy;
            filep->offset += copy;

            if(!filep->data_left) {
                LIBSSH2_FREE(session, filep->data);
                filep->data = NULL;
            }

            return copy;
        }

        if(filep->eof) {
            return 0;
        }
        else {
            /* We allow a number of bytes being requested at any given time
               without having been acked - until we reach EOF. */

            /* Number of bytes asked for that haven't been acked yet */
            size_t already = (size_t)(filep->offset_sent - filep->offset);

            size_t max_read_ahead = buffer_size*4;
            unsigned long recv_window;

            if(max_read_ahead > LIBSSH2_CHANNEL_WINDOW_DEFAULT*4)
                max_read_ahead = LIBSSH2_CHANNEL_WINDOW_DEFAULT*4;

            /* if the buffer_size passed in now is smaller than what has
               already been sent, we risk getting count become a very large
               number */
            if(max_read_ahead > already)
                count = max_read_ahead - already;

            /* 'count' is how much more data to ask for, and 'already' is how
               much data that already has been asked for but not yet returned.
               Specifically, 'count' means how much data that have or will be
               asked for by the nodes that are already added to the linked
               list. Some of those read requests may not actually have been
               sent off successfully yet.

               If 'already' is very large it should be perfectly fine to have
               count set to 0 as then we don't have to ask for more data
               (right now).

               buffer_size*4 is just picked more or less out of the air. The
               idea is that when reading SFTP from a remote server, we send
               away multiple read requests guessing that the client will read
               more than only this 'buffer_size' amount of memory. So we ask
               for maximum buffer_size*4 amount of data so that we can return
               them very fast in subsequent calls.
            */

            recv_window = libssh2_channel_window_read_ex(sftp->channel,
                                                         NULL, NULL);
            if(max_read_ahead > recv_window) {
                /* more data will be asked for than what the window currently
                   allows, expand it! */

                rc = _libssh2_channel_receive_window_adjust(sftp->channel,
                                               (uint32_t)(max_read_ahead * 8),
                                               1, NULL);
                /* if this returns EAGAIN, we will get back to this function
                   at next call */
                assert(rc != LIBSSH2_ERROR_EAGAIN || !filep->data_left);
                assert(rc != LIBSSH2_ERROR_EAGAIN || !filep->eof);
                if(rc)
                    return rc;
            }
        }

        while(count > 0) {
            unsigned char *s;

            /* 25 = packet_len(4) + packet_type(1) + request_id(4) +
               handle_len(4) + offset(8) + count(4) */
            uint32_t packet_len = (uint32_t)(handle->handle_len + 25);
            uint32_t request_id;

            uint32_t size = (uint32_t)count;
            if(size < buffer_size)
                size = (uint32_t)buffer_size;
            if(size > MAX_SFTP_READ_SIZE)
                size = MAX_SFTP_READ_SIZE;

            chunk = LIBSSH2_ALLOC(session, packet_len +
                                  sizeof(struct sftp_pipeline_chunk));
            if(!chunk)
                return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                      "malloc fail for FXP_WRITE");

            chunk->offset = filep->offset_sent;
            chunk->len = size;
            chunk->lefttosend = packet_len;
            chunk->sent = 0;

            s = chunk->packet;

            _libssh2_store_u32(&s, packet_len - 4);
            *s++ = SSH_FXP_READ;
            request_id = sftp->request_id++;
            chunk->request_id = request_id;
            _libssh2_store_u32(&s, request_id);
            _libssh2_store_str(&s, handle->handle, handle->handle_len);
            _libssh2_store_u64(&s, filep->offset_sent);
            filep->offset_sent += size; /* advance offset at once */
            _libssh2_store_u32(&s, size);

            /* add this new entry LAST in the list */
            _libssh2_list_add(&handle->packet_list, &chunk->node);
            /* deduct the size we used, as we might have to create
               more packets */
            count -= LIBSSH2_MIN(size, count);
            _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                           "read request id %d sent (offset: %lu, size: %lu)",
                           request_id, (unsigned long)chunk->offset,
                           (unsigned long)chunk->len));
        }
        LIBSSH2_FALLTHROUGH();
    case libssh2_NB_state_sent:

        sftp->read_state = libssh2_NB_state_idle;

        /* move through the READ packets that haven't been sent and send as
           many as possible - remember that we don't block */
        chunk = _libssh2_list_first(&handle->packet_list);

        while(chunk) {
            if(chunk->lefttosend) {

                rc = _libssh2_channel_write(channel, 0,
                                            &chunk->packet[chunk->sent],
                                            chunk->lefttosend);
                if(rc < 0) {
                    sftp->read_state = libssh2_NB_state_sent;
                    return rc;
                }

                /* remember where to continue sending the next time */
                chunk->lefttosend -= rc;
                chunk->sent += rc;

                if(chunk->lefttosend) {
                    /* We still have data left to send for this chunk.
                     * If there is at least one completely sent chunk,
                     * we can get out of this loop and start reading.  */
                    if(chunk != _libssh2_list_first(&handle->packet_list)) {
                        break;
                    }
                    else {
                        continue;
                    }
                }
            }

            /* move on to the next chunk with data to send */
            chunk = _libssh2_list_next(&chunk->node);
        }
        LIBSSH2_FALLTHROUGH();

    case libssh2_NB_state_sent2:

        sftp->read_state = libssh2_NB_state_idle;

        /*
         * Count all ACKed packets and act on the contents of them.
         */
        chunk = _libssh2_list_first(&handle->packet_list);

        while(chunk) {
            unsigned char *data;
            size_t data_len = 0;
            uint32_t rc32;
            static const unsigned char read_responses[2] = {
                SSH_FXP_DATA, SSH_FXP_STATUS
            };

            if(chunk->lefttosend) {
                /* if the chunk still has data left to send, we shouldn't wait
                   for an ACK for it just yet */
                if(bytes_in_buffer > 0) {
                    return bytes_in_buffer;
                }
                else {
                    /* we should never reach this point */
                    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                          "sftp_read() internal error");
                }
            }

            rc = sftp_packet_requirev(sftp, 2, read_responses,
                                      chunk->request_id, &data, &data_len, 9);
            if(rc == LIBSSH2_ERROR_EAGAIN && bytes_in_buffer) {
                /* do not return EAGAIN if we have already
                 * written data into the buffer */
                return bytes_in_buffer;
            }

            if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
                if(data_len > 0) {
                    LIBSSH2_FREE(session, data);
                }
                return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                      "Response too small");
            }
            else if(rc < 0) {
                sftp->read_state = libssh2_NB_state_sent2;
                return rc;
            }

            /*
             * We get DATA or STATUS back. STATUS can be error, or it is
             * FX_EOF when we reach the end of the file.
             */

            switch(data[0]) {
            case SSH_FXP_STATUS:
                /* remove the chunk we just processed */

                _libssh2_list_remove(&chunk->node);
                LIBSSH2_FREE(session, chunk);

                /* we must remove all outstanding READ requests, as either we
                   got an error or we're at end of file */
                sftp_packetlist_flush(handle);

                rc32 = _libssh2_ntohu32(data + 5);
                LIBSSH2_FREE(session, data);

                if(rc32 == LIBSSH2_FX_EOF) {
                    filep->eof = TRUE;
                    return bytes_in_buffer;
                }
                else {
                    sftp->last_errno = rc32;
                    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                          "SFTP READ error");
                }

            case SSH_FXP_DATA:
                if(chunk->offset != filep->offset) {
                    /* This could happen if the server returns less bytes than
                       requested, which shouldn't happen for normal files. See:
                       https://tools.ietf.org/html/draft-ietf-secsh-filexfer-02
                       #section-6.4
                     */
                    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                          "Read Packet At Unexpected Offset");
                }

                rc32 = _libssh2_ntohu32(data + 5);
                if(rc32 > (data_len - 9))
                    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                          "SFTP Protocol badness");

                if(rc32 > chunk->len) {
                    /* A chunk larger than we requested was returned to us.
                       This is a protocol violation and we don't know how to
                       deal with it. Bail out! */
                    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                          "FXP_READ response too big");
                }

                if(rc32 != chunk->len) {
                    /* a short read does not imply end of file, but we must
                       adjust the offset_sent since it was advanced with a
                       full chunk->len before */
                    filep->offset_sent -= (chunk->len - rc32);
                }

                if((bytes_in_buffer + rc32) > buffer_size) {
                    /* figure out the overlap amount */
                    filep->data_left = (bytes_in_buffer + rc32) - buffer_size;

                    /* getting the full packet would overflow the buffer, so
                       only get the correct amount and keep the remainder */
                    rc32 = (uint32_t)(buffer_size - bytes_in_buffer);

                    /* store data to keep for next call */
                    filep->data = data;
                    filep->data_len = data_len;
                }
                else
                    filep->data_len = 0;

                /* copy the received data from the received FXP_DATA packet to
                   the buffer at the correct index */
                memcpy(sliding_bufferp, data + 9, rc32);
                filep->offset += rc32;
                bytes_in_buffer += rc32;
                sliding_bufferp += rc32;

                if(filep->data_len == 0)
                    /* free the allocated data if not stored to keep */
                    LIBSSH2_FREE(session, data);

                /* remove the chunk we just processed keeping track of the
                 * next one in case we need it */
                next = _libssh2_list_next(&chunk->node);
                _libssh2_list_remove(&chunk->node);
                LIBSSH2_FREE(session, chunk);

                /* check if we have space left in the buffer
                 * and either continue to the next chunk or stop
                 */
                if(bytes_in_buffer < buffer_size) {
                    chunk = next;
                }
                else {
                    chunk = NULL;
                }

                break;
            default:
                return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                      "SFTP Protocol badness: unrecognised "
                                      "read request response");
            }
        }

        if(bytes_in_buffer > 0)
            return bytes_in_buffer;

        break;

    default:
        assert(0);  /* State machine error; unrecognised read state */
    }

    /* we should never reach this point */
    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                          "sftp_read() internal error");
}